

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

void __thiscall draco::ObjEncoder::EncodeFloatList(ObjEncoder *this,float *vals,int num_vals)

{
  EncoderBuffer *pEVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (0 < num_vals) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        pEVar1 = this->out_buffer_;
        in_RAX = CONCAT17(0x20,(int7)in_RAX);
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&stack0xffffffffffffffcf,
                     &stack0xffffffffffffffd0,in_R8,in_R9,in_RAX);
        }
      }
      EncodeFloat(this,vals[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)num_vals != uVar2);
  }
  return;
}

Assistant:

void ObjEncoder::EncodeFloatList(float *vals, int num_vals) {
  for (int i = 0; i < num_vals; ++i) {
    if (i > 0) {
      buffer()->Encode(' ');
    }
    EncodeFloat(vals[i]);
  }
}